

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadMaterial(ColladaParser *this,Material *pMaterial)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  char *local_28;
  char *url;
  Material *pMStack_18;
  int attrUrl;
  Material *pMaterial_local;
  ColladaParser *this_local;
  
  pMStack_18 = pMaterial;
  pMaterial_local = (Material *)this;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar2 & 1) == 0) {
            return;
          }
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 == 1) break;
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 == 2) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"material");
            if (iVar3 == 0) {
              return;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_80,"Expected end of <material> element.",&local_81);
            ThrowException(this,&local_80);
          }
        }
        bVar1 = IsElement(this,"material");
        if (!bVar1) break;
        SkipElement(this);
      }
      bVar1 = IsElement(this,"instance_effect");
      if (bVar1) break;
      SkipElement(this);
    }
    url._4_4_ = GetAttribute(this,"url");
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)url._4_4_);
    local_28 = (char *)CONCAT44(extraout_var,iVar3);
    if (*local_28 != '#') break;
    std::__cxx11::string::operator=((string *)&pMStack_18->mEffect,local_28 + 1);
    SkipElement(this);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"Unknown reference format",&local_49);
  ThrowException(this,&local_48);
}

Assistant:

void ColladaParser::ReadMaterial(Collada::Material& pMaterial)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("material")) {
                SkipElement();
            }
            else if (IsElement("instance_effect"))
            {
                // referred effect by URL
                int attrUrl = GetAttribute("url");
                const char* url = mReader->getAttributeValue(attrUrl);
                if (url[0] != '#')
                    ThrowException("Unknown reference format");

                pMaterial.mEffect = url + 1;

                SkipElement();
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "material") != 0)
                ThrowException("Expected end of <material> element.");

            break;
        }
    }
}